

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_sse2.c
# Opt level: O0

void av1_wedge_compute_delta_squares_sse2(int16_t *d,int16_t *a,int16_t *b,int N)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  longlong in_RCX;
  void *in_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  void *in_RSI;
  void *in_RDI;
  void *a_00;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i alVar17;
  __m128i v_mask_w;
  __m128i v_mask_w_00;
  __m128i v_mask_w_01;
  __m128i v_mask_w_02;
  __m128i v_mask_w_03;
  __m128i v_mask_w_04;
  __m128i v_mask_w_05;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i v_v_w;
  __m128i v_v_w_00;
  __m128i v_v_w_01;
  __m128i v_v_w_02;
  __m128i v_v_w_03;
  __m128i v_v_w_04;
  __m128i v_v_w_05;
  __m128i v_v_w_06;
  __m128i v_r3_w;
  __m128i v_r2_w;
  __m128i v_r1_w;
  __m128i v_r0_w;
  __m128i v_r3h_w;
  __m128i v_r3l_w;
  __m128i v_r2h_w;
  __m128i v_r2l_w;
  __m128i v_r1h_w;
  __m128i v_r1l_w;
  __m128i v_r0h_w;
  __m128i v_r0l_w;
  __m128i v_abh3n_w;
  __m128i v_abl3n_w;
  __m128i v_abh2n_w;
  __m128i v_abl2n_w;
  __m128i v_abh1n_w;
  __m128i v_abl1n_w;
  __m128i v_abh0n_w;
  __m128i v_abl0n_w;
  __m128i v_ab3h_w;
  __m128i v_ab3l_w;
  __m128i v_ab2h_w;
  __m128i v_ab2l_w;
  __m128i v_ab1h_w;
  __m128i v_ab1l_w;
  __m128i v_ab0h_w;
  __m128i v_ab0l_w;
  __m128i v_b3_w;
  __m128i v_a3_w;
  __m128i v_b2_w;
  __m128i v_a2_w;
  __m128i v_b1_w;
  __m128i v_a1_w;
  __m128i v_b0_w;
  __m128i v_a0_w;
  __m128i v_neg_w;
  undefined4 local_2c4;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 local_298;
  undefined2 uStack_296;
  undefined2 uStack_294;
  undefined2 uStack_292;
  undefined2 local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 local_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined2 local_268;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 local_258;
  undefined2 uStack_256;
  undefined2 uStack_254;
  undefined2 uStack_252;
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined2 uStack_1f0;
  undefined2 uStack_1ee;
  undefined2 uStack_1ec;
  undefined2 uStack_1ea;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  longlong extraout_RDX;
  
  local_2c4 = (int)in_RCX;
  local_2c0 = in_RDX;
  local_2b8 = in_RSI;
  local_2b0 = in_RDI;
  do {
    xx_load_128(local_2b8);
    xx_load_128(local_2c0);
    xx_load_128((void *)((long)local_2b8 + 0x10));
    xx_load_128((void *)((long)local_2c0 + 0x10));
    xx_load_128((void *)((long)local_2b8 + 0x20));
    xx_load_128((void *)((long)local_2c0 + 0x20));
    xx_load_128((void *)((long)local_2b8 + 0x30));
    a_00 = (void *)((long)local_2c0 + 0x30);
    alVar17 = xx_load_128(a_00);
    alVar17[0] = alVar17[1];
    local_238 = (undefined2)extraout_XMM0_Qa;
    uStack_236 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x10);
    uStack_234 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x20);
    uStack_232 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x30);
    local_248 = (undefined2)extraout_XMM0_Qa_00;
    uStack_246 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    uStack_244 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    uStack_242 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    uStack_1b0 = (undefined2)extraout_XMM0_Qb;
    uStack_1ae = (undefined2)((ulong)extraout_XMM0_Qb >> 0x10);
    uStack_1ac = (undefined2)((ulong)extraout_XMM0_Qb >> 0x20);
    uStack_1aa = (undefined2)((ulong)extraout_XMM0_Qb >> 0x30);
    uStack_1c0 = (undefined2)extraout_XMM0_Qb_00;
    uStack_1be = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    uStack_1bc = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    uStack_1ba = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    local_258 = (undefined2)extraout_XMM0_Qa_01;
    uStack_256 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x10);
    uStack_254 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    uStack_252 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x30);
    local_268 = (undefined2)extraout_XMM0_Qa_02;
    uStack_266 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x10);
    uStack_264 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x20);
    uStack_262 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x30);
    uStack_1d0 = (undefined2)extraout_XMM0_Qb_01;
    uStack_1ce = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x10);
    uStack_1cc = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    uStack_1ca = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x30);
    uStack_1e0 = (undefined2)extraout_XMM0_Qb_02;
    uStack_1de = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x10);
    uStack_1dc = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x20);
    uStack_1da = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x30);
    local_278 = (undefined2)extraout_XMM0_Qa_03;
    uStack_276 = (undefined2)((ulong)extraout_XMM0_Qa_03 >> 0x10);
    uStack_274 = (undefined2)((ulong)extraout_XMM0_Qa_03 >> 0x20);
    uStack_272 = (undefined2)((ulong)extraout_XMM0_Qa_03 >> 0x30);
    local_288 = (undefined2)extraout_XMM0_Qa_04;
    uStack_286 = (undefined2)((ulong)extraout_XMM0_Qa_04 >> 0x10);
    uStack_284 = (undefined2)((ulong)extraout_XMM0_Qa_04 >> 0x20);
    uStack_282 = (undefined2)((ulong)extraout_XMM0_Qa_04 >> 0x30);
    uStack_1f0 = (undefined2)extraout_XMM0_Qb_03;
    uStack_1ee = (undefined2)((ulong)extraout_XMM0_Qb_03 >> 0x10);
    uStack_1ec = (undefined2)((ulong)extraout_XMM0_Qb_03 >> 0x20);
    uStack_1ea = (undefined2)((ulong)extraout_XMM0_Qb_03 >> 0x30);
    uStack_200 = (undefined2)extraout_XMM0_Qb_04;
    uStack_1fe = (undefined2)((ulong)extraout_XMM0_Qb_04 >> 0x10);
    uStack_1fc = (undefined2)((ulong)extraout_XMM0_Qb_04 >> 0x20);
    uStack_1fa = (undefined2)((ulong)extraout_XMM0_Qb_04 >> 0x30);
    local_298 = (undefined2)extraout_XMM0_Qa_05;
    uStack_296 = (undefined2)((ulong)extraout_XMM0_Qa_05 >> 0x10);
    uStack_294 = (undefined2)((ulong)extraout_XMM0_Qa_05 >> 0x20);
    uStack_292 = (undefined2)((ulong)extraout_XMM0_Qa_05 >> 0x30);
    local_2a8 = (undefined2)extraout_XMM0_Qa_06;
    uStack_2a6 = (undefined2)((ulong)extraout_XMM0_Qa_06 >> 0x10);
    uStack_2a4 = (undefined2)((ulong)extraout_XMM0_Qa_06 >> 0x20);
    uStack_2a2 = (undefined2)((ulong)extraout_XMM0_Qa_06 >> 0x30);
    uStack_210 = (undefined2)extraout_XMM0_Qb_05;
    uStack_20e = (undefined2)((ulong)extraout_XMM0_Qb_05 >> 0x10);
    uStack_20c = (undefined2)((ulong)extraout_XMM0_Qb_05 >> 0x20);
    uStack_20a = (undefined2)((ulong)extraout_XMM0_Qb_05 >> 0x30);
    uStack_220 = (undefined2)extraout_XMM0_Qb_06;
    uStack_21e = (undefined2)((ulong)extraout_XMM0_Qb_06 >> 0x10);
    uStack_21c = (undefined2)((ulong)extraout_XMM0_Qb_06 >> 0x20);
    uStack_21a = (undefined2)((ulong)extraout_XMM0_Qb_06 >> 0x30);
    alVar17[1] = in_RCX;
    v_v_w[1] = (longlong)in_RSI;
    v_v_w[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w,alVar17);
    v_mask_w[0] = alVar17[1];
    v_mask_w[1] = in_RCX;
    v_v_w_00[1] = (longlong)in_RSI;
    v_v_w_00[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w_00,v_mask_w);
    v_mask_w_00[0] = alVar17[1];
    v_mask_w_00[1] = in_RCX;
    v_v_w_01[1] = (longlong)in_RSI;
    v_v_w_01[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w_01,v_mask_w_00);
    v_mask_w_01[0] = alVar17[1];
    v_mask_w_01[1] = in_RCX;
    v_v_w_02[1] = (longlong)in_RSI;
    v_v_w_02[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w_02,v_mask_w_01);
    v_mask_w_02[0] = alVar17[1];
    v_mask_w_02[1] = in_RCX;
    v_v_w_03[1] = (longlong)in_RSI;
    v_v_w_03[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w_03,v_mask_w_02);
    v_mask_w_03[0] = alVar17[1];
    v_mask_w_03[1] = in_RCX;
    v_v_w_04[1] = (longlong)in_RSI;
    v_v_w_04[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w_04,v_mask_w_03);
    v_mask_w_04[0] = alVar17[1];
    v_mask_w_04[1] = in_RCX;
    v_v_w_05[1] = (longlong)in_RSI;
    v_v_w_05[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w_05,v_mask_w_04);
    v_mask_w_05[0] = alVar17[1];
    v_mask_w_05[1] = in_RCX;
    v_v_w_06[1] = (longlong)in_RSI;
    v_v_w_06[0] = (longlong)a_00;
    alVar17 = negm_epi16(v_v_w_06,v_mask_w_05);
    v[1] = alVar17[1];
    auVar8._2_2_ = local_248;
    auVar8._0_2_ = local_238;
    auVar8._4_2_ = uStack_236;
    auVar8._6_2_ = uStack_246;
    auVar8._10_2_ = uStack_244;
    auVar8._8_2_ = uStack_234;
    auVar8._12_2_ = uStack_232;
    auVar8._14_2_ = uStack_242;
    auVar9._8_8_ = extraout_XMM0_Qb_07;
    auVar9._0_8_ = extraout_XMM0_Qa_07;
    auVar9 = pmaddwd(auVar8,auVar9);
    auVar7._2_2_ = uStack_1c0;
    auVar7._0_2_ = uStack_1b0;
    auVar7._4_2_ = uStack_1ae;
    auVar7._6_2_ = uStack_1be;
    auVar7._10_2_ = uStack_1bc;
    auVar7._8_2_ = uStack_1ac;
    auVar7._12_2_ = uStack_1aa;
    auVar7._14_2_ = uStack_1ba;
    auVar10._8_8_ = extraout_XMM0_Qb_08;
    auVar10._0_8_ = extraout_XMM0_Qa_08;
    auVar10 = pmaddwd(auVar7,auVar10);
    auVar6._2_2_ = local_268;
    auVar6._0_2_ = local_258;
    auVar6._4_2_ = uStack_256;
    auVar6._6_2_ = uStack_266;
    auVar6._10_2_ = uStack_264;
    auVar6._8_2_ = uStack_254;
    auVar6._12_2_ = uStack_252;
    auVar6._14_2_ = uStack_262;
    auVar11._8_8_ = extraout_XMM0_Qb_09;
    auVar11._0_8_ = extraout_XMM0_Qa_09;
    auVar11 = pmaddwd(auVar6,auVar11);
    auVar5._2_2_ = uStack_1e0;
    auVar5._0_2_ = uStack_1d0;
    auVar5._4_2_ = uStack_1ce;
    auVar5._6_2_ = uStack_1de;
    auVar5._10_2_ = uStack_1dc;
    auVar5._8_2_ = uStack_1cc;
    auVar5._12_2_ = uStack_1ca;
    auVar5._14_2_ = uStack_1da;
    auVar12._8_8_ = extraout_XMM0_Qb_10;
    auVar12._0_8_ = extraout_XMM0_Qa_10;
    auVar12 = pmaddwd(auVar5,auVar12);
    auVar4._2_2_ = local_288;
    auVar4._0_2_ = local_278;
    auVar4._4_2_ = uStack_276;
    auVar4._6_2_ = uStack_286;
    auVar4._10_2_ = uStack_284;
    auVar4._8_2_ = uStack_274;
    auVar4._12_2_ = uStack_272;
    auVar4._14_2_ = uStack_282;
    auVar13._8_8_ = extraout_XMM0_Qb_11;
    auVar13._0_8_ = extraout_XMM0_Qa_11;
    auVar13 = pmaddwd(auVar4,auVar13);
    auVar3._2_2_ = uStack_200;
    auVar3._0_2_ = uStack_1f0;
    auVar3._4_2_ = uStack_1ee;
    auVar3._6_2_ = uStack_1fe;
    auVar3._10_2_ = uStack_1fc;
    auVar3._8_2_ = uStack_1ec;
    auVar3._12_2_ = uStack_1ea;
    auVar3._14_2_ = uStack_1fa;
    auVar14._8_8_ = extraout_XMM0_Qb_12;
    auVar14._0_8_ = extraout_XMM0_Qa_12;
    auVar14 = pmaddwd(auVar3,auVar14);
    auVar2._2_2_ = local_2a8;
    auVar2._0_2_ = local_298;
    auVar2._4_2_ = uStack_296;
    auVar2._6_2_ = uStack_2a6;
    auVar2._10_2_ = uStack_2a4;
    auVar2._8_2_ = uStack_294;
    auVar2._12_2_ = uStack_292;
    auVar2._14_2_ = uStack_2a2;
    auVar15._8_8_ = extraout_XMM0_Qb_13;
    auVar15._0_8_ = extraout_XMM0_Qa_13;
    auVar15 = pmaddwd(auVar2,auVar15);
    auVar1._2_2_ = uStack_220;
    auVar1._0_2_ = uStack_210;
    auVar1._4_2_ = uStack_20e;
    auVar1._6_2_ = uStack_21e;
    auVar1._10_2_ = uStack_21c;
    auVar1._8_2_ = uStack_20c;
    auVar1._12_2_ = uStack_20a;
    auVar1._14_2_ = uStack_21a;
    auVar16._8_8_ = extraout_XMM0_Qb_14;
    auVar16._0_8_ = extraout_XMM0_Qa_14;
    auVar16 = pmaddwd(auVar1,auVar16);
    packssdw(auVar9,auVar10);
    packssdw(auVar11,auVar12);
    packssdw(auVar13,auVar14);
    packssdw(auVar15,auVar16);
    v[0] = (longlong)in_RSI;
    xx_store_128(local_2b0,v);
    v_00[1] = extraout_RDX;
    v_00[0] = (longlong)in_RSI;
    xx_store_128((void *)((long)local_2b0 + 0x10),v_00);
    v_01[1] = extraout_RDX_00;
    v_01[0] = (longlong)in_RSI;
    xx_store_128((void *)((long)local_2b0 + 0x20),v_01);
    v_02[1] = extraout_RDX_01;
    v_02[0] = (longlong)in_RSI;
    xx_store_128((void *)((long)local_2b0 + 0x30),v_02);
    local_2b8 = (void *)((long)local_2b8 + 0x40);
    local_2c0 = (void *)((long)local_2c0 + 0x40);
    local_2b0 = (void *)((long)local_2b0 + 0x40);
    local_2c4 = local_2c4 + -0x20;
  } while (local_2c4 != 0);
  return;
}

Assistant:

void av1_wedge_compute_delta_squares_sse2(int16_t *d, const int16_t *a,
                                          const int16_t *b, int N) {
  const __m128i v_neg_w = _mm_set_epi16((short)0xffff, 0, (short)0xffff, 0,
                                        (short)0xffff, 0, (short)0xffff, 0);

  assert(N % 64 == 0);

  do {
    const __m128i v_a0_w = xx_load_128(a);
    const __m128i v_b0_w = xx_load_128(b);
    const __m128i v_a1_w = xx_load_128(a + 8);
    const __m128i v_b1_w = xx_load_128(b + 8);
    const __m128i v_a2_w = xx_load_128(a + 16);
    const __m128i v_b2_w = xx_load_128(b + 16);
    const __m128i v_a3_w = xx_load_128(a + 24);
    const __m128i v_b3_w = xx_load_128(b + 24);

    const __m128i v_ab0l_w = _mm_unpacklo_epi16(v_a0_w, v_b0_w);
    const __m128i v_ab0h_w = _mm_unpackhi_epi16(v_a0_w, v_b0_w);
    const __m128i v_ab1l_w = _mm_unpacklo_epi16(v_a1_w, v_b1_w);
    const __m128i v_ab1h_w = _mm_unpackhi_epi16(v_a1_w, v_b1_w);
    const __m128i v_ab2l_w = _mm_unpacklo_epi16(v_a2_w, v_b2_w);
    const __m128i v_ab2h_w = _mm_unpackhi_epi16(v_a2_w, v_b2_w);
    const __m128i v_ab3l_w = _mm_unpacklo_epi16(v_a3_w, v_b3_w);
    const __m128i v_ab3h_w = _mm_unpackhi_epi16(v_a3_w, v_b3_w);

    // Negate top word of pairs
    const __m128i v_abl0n_w = negm_epi16(v_ab0l_w, v_neg_w);
    const __m128i v_abh0n_w = negm_epi16(v_ab0h_w, v_neg_w);
    const __m128i v_abl1n_w = negm_epi16(v_ab1l_w, v_neg_w);
    const __m128i v_abh1n_w = negm_epi16(v_ab1h_w, v_neg_w);
    const __m128i v_abl2n_w = negm_epi16(v_ab2l_w, v_neg_w);
    const __m128i v_abh2n_w = negm_epi16(v_ab2h_w, v_neg_w);
    const __m128i v_abl3n_w = negm_epi16(v_ab3l_w, v_neg_w);
    const __m128i v_abh3n_w = negm_epi16(v_ab3h_w, v_neg_w);

    const __m128i v_r0l_w = _mm_madd_epi16(v_ab0l_w, v_abl0n_w);
    const __m128i v_r0h_w = _mm_madd_epi16(v_ab0h_w, v_abh0n_w);
    const __m128i v_r1l_w = _mm_madd_epi16(v_ab1l_w, v_abl1n_w);
    const __m128i v_r1h_w = _mm_madd_epi16(v_ab1h_w, v_abh1n_w);
    const __m128i v_r2l_w = _mm_madd_epi16(v_ab2l_w, v_abl2n_w);
    const __m128i v_r2h_w = _mm_madd_epi16(v_ab2h_w, v_abh2n_w);
    const __m128i v_r3l_w = _mm_madd_epi16(v_ab3l_w, v_abl3n_w);
    const __m128i v_r3h_w = _mm_madd_epi16(v_ab3h_w, v_abh3n_w);

    const __m128i v_r0_w = _mm_packs_epi32(v_r0l_w, v_r0h_w);
    const __m128i v_r1_w = _mm_packs_epi32(v_r1l_w, v_r1h_w);
    const __m128i v_r2_w = _mm_packs_epi32(v_r2l_w, v_r2h_w);
    const __m128i v_r3_w = _mm_packs_epi32(v_r3l_w, v_r3h_w);

    xx_store_128(d, v_r0_w);
    xx_store_128(d + 8, v_r1_w);
    xx_store_128(d + 16, v_r2_w);
    xx_store_128(d + 24, v_r3_w);

    a += 32;
    b += 32;
    d += 32;
    N -= 32;
  } while (N);
}